

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O0

void double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange
               (int min_exponent,int max_exponent,DiyFp *power,int *decimal_exponent)

{
  double dVar1;
  uint64_t significand;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  int *in_RCX;
  uint64_t *in_RDX;
  int in_EDI;
  long in_FS_OFFSET;
  int index;
  int foo;
  double k;
  int kQ;
  CachedPower cached_power;
  short sStack_20;
  short sStack_1e;
  DiyFp local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = ceil((double)(in_EDI + 0x3f) * 0.30102999566398114);
  iVar3 = (int)dVar1 + 0x15b;
  if (iVar3 < 0) {
    iVar3 = (int)dVar1 + 0x162;
  }
  lVar4 = (long)((iVar3 >> 3) + 1) * 0x10;
  significand = *(uint64_t *)(kCachedPowers + lVar4);
  uVar2 = *(undefined8 *)(kCachedPowers + lVar4 + 8);
  sStack_1e = (short)((ulong)uVar2 >> 0x10);
  *in_RCX = (int)sStack_1e;
  sStack_20 = (short)uVar2;
  DiyFp::DiyFp(&local_18,significand,(int)sStack_20);
  *(int32_t *)(in_RDX + 1) = local_18.e_;
  *in_RDX = local_18.f_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetCachedPowerForBinaryExponentRange(
    int min_exponent,
    int max_exponent,
    DiyFp* power,
    int* decimal_exponent) {
  int kQ = DiyFp::kSignificandSize;
  double k = ceil((min_exponent + kQ - 1) * kD_1_LOG2_10);
  int foo = kCachedPowersOffset;
  int index =
      (foo + static_cast<int>(k) - 1) / kDecimalExponentDistance + 1;
  DOUBLE_CONVERSION_ASSERT(0 <= index && index < static_cast<int>(DOUBLE_CONVERSION_ARRAY_SIZE(kCachedPowers)));
  CachedPower cached_power = kCachedPowers[index];
  DOUBLE_CONVERSION_ASSERT(min_exponent <= cached_power.binary_exponent);
  (void) max_exponent;  // Mark variable as used.
  DOUBLE_CONVERSION_ASSERT(cached_power.binary_exponent <= max_exponent);
  *decimal_exponent = cached_power.decimal_exponent;
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
}